

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp15.c
# Opt level: O1

void G15_(PDISASM pMyDisasm)

{
  char *pcVar1;
  ulong uVar2;
  UIntPtr UVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar2 != 0) && (uVar2 < (pMyDisasm->Reserved_).EIP_ + 2)) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return;
  }
  UVar3 = (pMyDisasm->Reserved_).EIP_;
  uVar5 = *(byte *)(UVar3 + 1) >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = uVar5;
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    switch(uVar5) {
    case 0:
      if (((pMyDisasm->Reserved_).Architecture == 0x40) &&
         (uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6), (pMyDisasm->Reserved_).MOD_ = uVar5, uVar5 == 3
         )) {
        (pMyDisasm->Instruction).Category = 0x1a0000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rdfsbase",9);
        (pMyDisasm->Reserved_).OperandSize =
             (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).OpSize = (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20
        ;
        (pMyDisasm->Operand2).Registers.type = 0x800;
        (pMyDisasm->Operand2).Registers.segment = 0x10;
        return;
      }
      break;
    case 1:
      if (((pMyDisasm->Reserved_).Architecture == 0x40) &&
         (uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6), (pMyDisasm->Reserved_).MOD_ = uVar5, uVar5 == 3
         )) {
        (pMyDisasm->Instruction).Category = 0x1a0000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rdgsbase",9);
        (pMyDisasm->Reserved_).OperandSize =
             (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).OpSize = (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20
        ;
        (pMyDisasm->Operand2).Registers.type = 0x800;
        (pMyDisasm->Operand2).Registers.segment = 0x20;
        return;
      }
      break;
    case 2:
      if (((pMyDisasm->Reserved_).Architecture == 0x40) &&
         (uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6), (pMyDisasm->Reserved_).MOD_ = uVar5, uVar5 == 3
         )) {
        (pMyDisasm->Instruction).Category = 0x1a0000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"wrfsbase",9);
        (pMyDisasm->Reserved_).OperandSize =
             (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).OpSize = (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20
        ;
        (pMyDisasm->Operand1).Registers.type = 0x800;
        (pMyDisasm->Operand1).Registers.segment = 0x10;
        return;
      }
      break;
    case 3:
      if (((pMyDisasm->Reserved_).Architecture == 0x40) &&
         (uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6), (pMyDisasm->Reserved_).MOD_ = uVar5, uVar5 == 3
         )) {
        (pMyDisasm->Instruction).Category = 0x1a0000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"wrgsbase",9);
        (pMyDisasm->Reserved_).OperandSize =
             (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).OpSize = (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20
        ;
        (pMyDisasm->Operand1).Registers.type = 0x800;
        (pMyDisasm->Operand1).Registers.segment = 0x20;
        return;
      }
      break;
    case 4:
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      (pMyDisasm->Instruction).Category = 0x10000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"ptwrite",8);
      bVar6 = (pMyDisasm->Reserved_).REX.W_ == '\x01';
      (pMyDisasm->Reserved_).MemDecoration = bVar6 + 3;
      (pMyDisasm->Reserved_).OperandSize = (uint)bVar6 * 0x20 + 0x20;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 1;
      return;
    case 5:
      (pMyDisasm->Instruction).Category = 0x170000;
      uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar5;
      if (uVar5 == 3) {
        if (((pMyDisasm->Reserved_).REX.state == '\x01') &&
           ((pMyDisasm->Reserved_).REX.W_ == '\x01')) {
          uVar4 = 0x71707373636e69;
        }
        else {
          uVar4 = 0x64707373636e69;
        }
        *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar4;
        (pMyDisasm->Reserved_).OperandSize =
             (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01') * 0x20 + 0x20;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).OpSize = 0x40;
        (pMyDisasm->Operand1).Registers.type = 0x20;
        (pMyDisasm->Operand1).Registers.special = 4;
        return;
      }
    }
    goto switchD_001247c5_default;
  }
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((char)uVar5 == '\a') {
      uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar5;
      if (uVar5 != 3) {
        (pMyDisasm->Instruction).Category = 0x1c0000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"clflushopt",0xb);
        goto LAB_00124972;
      }
    }
    else if ((uVar5 == 6) &&
            (uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6), (pMyDisasm->Reserved_).MOD_ = uVar5,
            uVar5 != 3)) {
      (pMyDisasm->Instruction).Category = 0x1b0000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"clwb",5);
LAB_00124972:
      (pMyDisasm->Reserved_).MemDecoration = 1;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      return;
    }
switchD_001247c5_default:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  switch(uVar5) {
  case 0:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Reserved_).MemDecoration = 5;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Instruction).Category = 0x1d0000;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        builtin_strncpy(pcVar1,"fxsave64",9);
      }
      else {
        builtin_strncpy(pcVar1,"fxsave",7);
      }
      (pMyDisasm->Operand1).OpSize = 0x1000;
      (pMyDisasm->Instruction).ImplicitUsedRegs.type = 0x1006;
      (pMyDisasm->Instruction).ImplicitUsedRegs.fpu = 0xff;
      (pMyDisasm->Instruction).ImplicitUsedRegs.mmx = 0xff;
      (pMyDisasm->Instruction).ImplicitUsedRegs.xmm = 0xff;
      (pMyDisasm->Instruction).ImplicitUsedRegs.special = 2;
      goto LAB_00125209;
    }
    break;
  case 1:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Reserved_).MemDecoration = 5;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Instruction).Category = 0x1d0000;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        builtin_strncpy(pcVar1,"fxrstor64",10);
      }
      else {
        builtin_strncpy(pcVar1,"fxrstor",8);
      }
      (pMyDisasm->Operand1).OpSize = 0x1000;
      (pMyDisasm->Operand1).AccessMode = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x1006;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.fpu = 0xff;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.mmx = 0xff;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.xmm = 0xff;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.special = 2;
      goto LAB_00125209;
    }
    break;
  case 2:
    if (((pMyDisasm->Reserved_).EVEX.state == '\x01') ||
       (((pMyDisasm->Reserved_).VEX.state == '\x01' && ((pMyDisasm->Reserved_).VEX.L != '\0'))))
    goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x110013;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vldmxcsr",9);
      }
      else {
        (pMyDisasm->Instruction).Category = 0x40013;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"ldmxcsr",8);
      }
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x20;
      (pMyDisasm->Operand1).Registers.special = 2;
      (pMyDisasm->Operand1).OpSize = 0x20;
      goto LAB_00125209;
    }
    break;
  case 3:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Reserved_).MemDecoration = 3;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x110013;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vstmxcsr",9);
      }
      else {
        (pMyDisasm->Instruction).Category = 0x40013;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"stmxcsr",8);
      }
      (pMyDisasm->Operand2).OpType = 0x20000;
      (pMyDisasm->Operand2).Registers.type = 0x20;
      (pMyDisasm->Operand1).Registers.special = 2;
      (pMyDisasm->Operand2).OpSize = 0x20;
      goto LAB_00125209;
    }
    break;
  case 4:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    if ((pMyDisasm->Reserved_).MOD_ != 3) {
      (pMyDisasm->Reserved_).MemDecoration = 5;
      (pMyDisasm->Instruction).Category = 0x1e0000;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        builtin_strncpy(pcVar1,"xsave64",8);
      }
      else {
        builtin_strncpy(pcVar1,"xsave",6);
      }
      (pMyDisasm->Operand1).OpSize = 0x1000;
      (pMyDisasm->Operand1).AccessMode = 2;
      (pMyDisasm->Instruction).ImplicitUsedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitUsedRegs.gpr = 5;
      goto LAB_00125209;
    }
    break;
  case 5:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).MemDecoration = 5;
      (pMyDisasm->Instruction).Category = 0x1e0000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"xrstor",7);
      (pMyDisasm->Operand1).OpSize = 0x1000;
      (pMyDisasm->Operand1).AccessMode = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      goto LAB_00125209;
    }
    (pMyDisasm->Instruction).Category = 0x50019;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"lfen",4);
    goto LAB_00124f23;
  case 6:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Instruction).Category = 0x190000;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        builtin_strncpy(pcVar1,"xsaveopt64",0xb);
      }
      else {
        builtin_strncpy(pcVar1,"xsaveopt",9);
      }
      (pMyDisasm->Reserved_).MemDecoration = 5;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Operand1).OpSize = 0x1000;
      (pMyDisasm->Operand2).OpType = 0x20000;
      (pMyDisasm->Operand2).Registers.type = 1;
      (pMyDisasm->Operand2).Registers.gpr = 5;
      goto LAB_00125209;
    }
    (pMyDisasm->Instruction).Category = 0x50019;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mfen",4);
    goto LAB_00124f23;
  case 7:
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto switchD_001247c5_default;
    uVar5 = (uint)(*(byte *)(UVar3 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar5;
    if (uVar5 != 3) {
      (pMyDisasm->Reserved_).OperandSize = 8;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).MemDecoration = 0x65;
      (pMyDisasm->Instruction).Category = 0x50019;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"clflush",8);
      goto LAB_00125209;
    }
    (pMyDisasm->Instruction).Category = 0x50019;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"sfen",4);
LAB_00124f23:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"nce",4);
    goto LAB_00125209;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
LAB_00125209:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ G15_(PDISASM pMyDisasm)
{
  if (!Security(2, pMyDisasm)) return;
  GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
  /* ========= 0xf3 */
  if (GV.PrefRepe == 1) {
    if (GV.REGOPCODE == 0) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdfsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand2.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand2.Registers.segment = REG4;
    }
    else if (GV.REGOPCODE == 1) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdgsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand2.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand2.Registers.segment = REG5;
    }
    else if (GV.REGOPCODE == 2) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "wrfsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand1.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand1.Registers.segment = REG4;
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "wrgsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand1.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand1.Registers.segment = REG5;
    }
    else if (GV.REGOPCODE == 4) {
      if (pMyDisasm->Prefix.OperandSize == InUsePrefix) GV.ERROR_OPCODE = UD_;
      pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ptwrite");
      #endif
      GV.MemDecoration = (GV.REX.W_ == 1) ? Arg1qword : Arg1dword;
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ;
    }
    else if (GV.REGOPCODE == 5) {
      pMyDisasm->Instruction.Category = CET_INSTRUCTION;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if ((GV.REX.state == InUsePrefix) && (GV.REX.W_ == 1)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "incsspq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "incsspd");
        #endif
      }
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = 64;
      pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
      pMyDisasm->Operand1.Registers.special = REG2; /* SSP reg */
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  /* ========= 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    if (GV.REGOPCODE == 6) {
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        pMyDisasm->Instruction.Category = CLWB_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clwb");
        #endif
        GV.MemDecoration = Arg1byte;

        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      }
      else  {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 7) {
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        pMyDisasm->Instruction.Category = CLFLUSHOPT_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clflushopt");
        #endif
        GV.MemDecoration = Arg1byte;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (GV.REGOPCODE == 0) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Instruction.Category = FXSR_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxsave64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxsave");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Instruction.ImplicitUsedRegs.type = FPU_REG + SSE_REG + MMX_REG;
        pMyDisasm->Instruction.ImplicitUsedRegs.fpu = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.mmx = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.xmm = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.special = REG1; /* MXCSR Register */
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 1) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Instruction.Category = FXSR_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxrstor64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxrstor");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = FPU_REG + SSE_REG + MMX_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.fpu = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.mmx = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.xmm = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.special = REG1; /* MXCSR Register */

      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 2) {
      if (GV.EVEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      if ((GV.VEX.state == InUsePrefix) && (GV.VEX.L != 0)) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg2dword;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        if (GV.VEX.state == InUsePrefix) {
          pMyDisasm->Instruction.Category = AVX_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vldmxcsr");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = SSE_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ldmxcsr");
          #endif
        }
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
        pMyDisasm->Operand1.Registers.special = REG1;
        pMyDisasm->Operand1.OpSize = 32;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1dword;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        if (GV.VEX.state == InUsePrefix) {
          pMyDisasm->Instruction.Category = AVX_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vstmxcsr");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = SSE_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "stmxcsr");
          #endif
        }
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = SPECIAL_REG;
        pMyDisasm->Operand1.Registers.special = REG1;
        pMyDisasm->Operand2.OpSize = 32;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 4) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1multibytes;
        pMyDisasm->Instruction.Category = XSAVE_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsave64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsave");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = WRITE;
        pMyDisasm->Instruction.ImplicitUsedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitUsedRegs.gpr = REG0 + REG2;
      }
      else {
        failDecode(pMyDisasm);
      }
    }

    else if (GV.REGOPCODE == 5) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "lfence");
        #endif
      }
      else {
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.MemDecoration = Arg1multibytes;
        pMyDisasm->Instruction.Category = XSAVE_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xrstor");
        #endif
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0 | REG2;
      }
    }
    else if (GV.REGOPCODE == 6) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mfence");
        #endif
      }
      else {
        pMyDisasm->Instruction.Category = XSAVEOPT_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsaveopt64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsaveopt");
          #endif
        }
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type =  GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG0 + REG2;
      }
    }
    else if (GV.REGOPCODE == 7) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "sfence");
        #endif
      }
      else {
        GV.OperandSize = 8;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.OperandSize = 32;
        GV.MemDecoration = Arg2byte;
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clflush");
        #endif
      }
    }
    else {
      failDecode(pMyDisasm);
    }
    GV.EIP_+= GV.DECALAGE_EIP+2;
  }
}